

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O0

Norm2AllModes * icu_63::Norm2AllModes::createInstance(Normalizer2Impl *impl,UErrorCode *errorCode)

{
  UBool UVar1;
  Norm2AllModes *this;
  UErrorCode *size;
  Norm2AllModes *local_58;
  Norm2AllModes *allModes;
  UErrorCode *errorCode_local;
  Normalizer2Impl *impl_local;
  
  size = errorCode;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    this = (Norm2AllModes *)UMemory::operator_new((UMemory *)0x58,(size_t)size);
    local_58 = (Norm2AllModes *)0x0;
    if (this != (Norm2AllModes *)0x0) {
      Norm2AllModes(this,impl);
      local_58 = this;
    }
    if (local_58 == (Norm2AllModes *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      if (impl != (Normalizer2Impl *)0x0) {
        (*(impl->super_UObject)._vptr_UObject[1])();
      }
      impl_local = (Normalizer2Impl *)0x0;
    }
    else {
      impl_local = (Normalizer2Impl *)local_58;
    }
  }
  else {
    if (impl != (Normalizer2Impl *)0x0) {
      (*(impl->super_UObject)._vptr_UObject[1])();
    }
    impl_local = (Normalizer2Impl *)0x0;
  }
  return (Norm2AllModes *)impl_local;
}

Assistant:

Norm2AllModes *
Norm2AllModes::createInstance(Normalizer2Impl *impl, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        delete impl;
        return NULL;
    }
    Norm2AllModes *allModes=new Norm2AllModes(impl);
    if(allModes==NULL) {
        errorCode=U_MEMORY_ALLOCATION_ERROR;
        delete impl;
        return NULL;
    }
    return allModes;
}